

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  char local_88;
  char local_87;
  char local_86;
  char local_85;
  char local_84;
  undefined1 local_83;
  char local_82;
  char local_81;
  char zBuf [32];
  int local_5c;
  int n;
  int s;
  int Y;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  x._40_8_ = argv;
  iVar4 = isDate(context,argc,argv,(DateTime *)&s);
  if (iVar4 == 0) {
    computeYMD_HMS((DateTime *)&s);
    n = (int)x.iJD;
    if ((int)x.iJD < 0) {
      n = -(int)x.iJD;
    }
    local_87 = (char)((long)((ulong)(uint)((int)((long)n / 1000) >> 0x1f) << 0x20 |
                            (long)n / 1000 & 0xffffffffU) % 10) + '0';
    local_86 = (char)((long)((ulong)(uint)((int)((long)n / 100) >> 0x1f) << 0x20 |
                            (long)n / 100 & 0xffffffffU) % 10) + '0';
    local_85 = (char)((long)((ulong)(uint)((int)((long)n / 10) >> 0x1f) << 0x20 |
                            (long)n / 10 & 0xffffffffU) % 10) + '0';
    local_84 = (char)(n % 10) + '0';
    local_83 = 0x2d;
    local_82 = (char)((long)((ulong)(uint)((int)((long)x.iJD._4_4_ / 10) >> 0x1f) << 0x20 |
                            (long)x.iJD._4_4_ / 10 & 0xffffffffU) % 10) + '0';
    local_81 = (char)(x.iJD._4_4_ % 10) + '0';
    zBuf[0] = '-';
    zBuf[1] = (char)((long)((ulong)(uint)((int)((long)x.Y / 10) >> 0x1f) << 0x20 |
                           (long)x.Y / 10 & 0xffffffffU) % 10) + '0';
    zBuf[2] = (char)(x.Y % 10) + '0';
    zBuf[3] = ' ';
    zBuf[4] = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                           (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    zBuf[5] = (char)(x.M % 10) + '0';
    zBuf[6] = ':';
    zBuf[7] = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                           (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    zBuf[8] = (char)(x.D % 10) + '0';
    zBuf[9] = ':';
    if ((x.s._4_1_ >> 2 & 1) == 0) {
      uVar1 = (long)(int)(double)x._24_8_ / 10;
      cVar2 = (char)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 10);
      cVar3 = (char)((int)(double)x._24_8_ % 10);
      zBuf[0xc] = '\0';
      local_5c = 0x14;
    }
    else {
      iVar4 = (int)((double)x._24_8_ * 1000.0 + 0.5);
      cVar2 = (char)((long)((ulong)(uint)((int)((long)iVar4 / 10000) >> 0x1f) << 0x20 |
                           (long)iVar4 / 10000 & 0xffffffffU) % 10);
      cVar3 = (char)((long)((ulong)(uint)((int)((long)iVar4 / 1000) >> 0x1f) << 0x20 |
                           (long)iVar4 / 1000 & 0xffffffffU) % 10);
      zBuf[0xc] = '.';
      zBuf[0xd] = (char)((long)((ulong)(uint)((int)((long)iVar4 / 100) >> 0x1f) << 0x20 |
                               (long)iVar4 / 100 & 0xffffffffU) % 10) + '0';
      zBuf[0xe] = (char)((long)((ulong)(uint)((int)((long)iVar4 / 10) >> 0x1f) << 0x20 |
                               (long)iVar4 / 10 & 0xffffffffU) % 10) + '0';
      zBuf[0xf] = (char)(iVar4 % 10) + '0';
      zBuf[0x10] = '\0';
      local_5c = 0x18;
    }
    zBuf[0xb] = cVar3 + '0';
    zBuf[10] = cVar2 + '0';
    if ((int)x.iJD < 0) {
      local_88 = '-';
      sqlite3_result_text(context,&local_88,local_5c,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_text(context,&local_87,local_5c + -1,(_func_void_void_ptr *)0xffffffffffffffff)
      ;
    }
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}